

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

_Bool Curl_ssl_getsessionid
                (Curl_easy *data,connectdata *conn,_Bool isProxy,void **ssl_sessionid,size_t *idsize
                ,int sockindex)

{
  byte bVar1;
  int iVar2;
  char *first;
  Curl_share *pCVar3;
  Curl_ssl_session *pCVar4;
  char *second;
  long lVar5;
  ssl_primary_config *data_00;
  proxy_info *ppVar6;
  _Bool _Var7;
  int iVar8;
  uint uVar9;
  undefined7 in_register_00000011;
  ulong uVar10;
  long *plVar11;
  long lVar12;
  
  data_00 = &conn->proxy_ssl_config;
  ppVar6 = &conn->http_proxy;
  if ((int)CONCAT71(in_register_00000011,isProxy) == 0) {
    data_00 = &conn->ssl_config;
    ppVar6 = (proxy_info *)&conn->host;
  }
  first = (ppVar6->host).name;
  iVar2 = (&conn->port)[!isProxy];
  *ssl_sessionid = (void *)0x0;
  if (((conn->http_proxy).proxytype == '\x02') &&
     (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
    bVar1 = (data->set).proxy_ssl.primary.field_0x71;
  }
  else {
    bVar1 = (data->set).ssl.primary.field_0x71;
  }
  if (((bVar1 & 8) != 0) && ((data->state).session != (Curl_ssl_session *)0x0)) {
    pCVar3 = data->share;
    if ((pCVar3 == (Curl_share *)0x0) || ((pCVar3->specifier & 0x10) == 0)) {
      plVar11 = &(data->state).sessionage;
    }
    else {
      plVar11 = &pCVar3->sessionage;
    }
    if ((data->set).general_ssl.max_ssl_sessions != 0) {
      lVar12 = 0x38;
      uVar10 = 0;
      do {
        pCVar4 = (data->state).session;
        if ((*(long *)((long)pCVar4 + lVar12 + -0x20) != 0) &&
           (iVar8 = Curl_strcasecompare(first,*(char **)((long)pCVar4 + lVar12 + -0x38)), iVar8 != 0
           )) {
          uVar9 = *(uint *)&(conn->bits).field_0x4;
          second = *(char **)((long)pCVar4 + lVar12 + -0x30);
          if ((uVar9 >> 9 & 1) == 0) {
            if (second == (char *)0x0) {
LAB_004fd5e0:
              iVar8 = *(int *)((long)pCVar4 + lVar12 + -4);
              if ((uVar9 >> 10 & 1) == 0) {
                if (iVar8 == -1) {
LAB_004fd600:
                  if (((iVar2 == *(int *)((long)pCVar4 + lVar12 + -8)) &&
                      (iVar8 = Curl_strcasecompare(conn->handler->scheme,
                                                   *(char **)((long)pCVar4 + lVar12 + -0x28)),
                      iVar8 != 0)) &&
                     (_Var7 = Curl_ssl_config_matches
                                        (data_00,(ssl_primary_config *)
                                                 ((long)&pCVar4->name + lVar12)), _Var7)) {
                    lVar5 = *plVar11;
                    *plVar11 = lVar5 + 1;
                    *(long *)((long)pCVar4 + lVar12 + -0x10) = lVar5 + 1;
                    *ssl_sessionid = *(void **)((long)pCVar4 + lVar12 + -0x20);
                    if (idsize != (size_t *)0x0) {
                      *idsize = *(size_t *)((long)pCVar4 + lVar12 + -0x18);
                    }
                    return false;
                  }
                }
              }
              else if ((iVar8 != -1) && (conn->conn_to_port == iVar8)) goto LAB_004fd600;
            }
          }
          else if ((second != (char *)0x0) &&
                  (iVar8 = Curl_strcasecompare((conn->conn_to_host).name,second), iVar8 != 0)) {
            uVar9 = *(uint *)&(conn->bits).field_0x4;
            goto LAB_004fd5e0;
          }
        }
        uVar10 = uVar10 + 1;
        lVar12 = lVar12 + 0xb0;
      } while (uVar10 < (data->set).general_ssl.max_ssl_sessions);
    }
  }
  return true;
}

Assistant:

bool Curl_ssl_getsessionid(struct Curl_easy *data,
                           struct connectdata *conn,
                           const bool isProxy,
                           void **ssl_sessionid,
                           size_t *idsize, /* set 0 if unknown */
                           int sockindex)
{
  struct Curl_ssl_session *check;
  size_t i;
  long *general_age;
  bool no_match = TRUE;

#ifndef CURL_DISABLE_PROXY
  struct ssl_primary_config * const ssl_config = isProxy ?
    &conn->proxy_ssl_config :
    &conn->ssl_config;
  const char * const name = isProxy ?
    conn->http_proxy.host.name : conn->host.name;
  int port = isProxy ? (int)conn->port : conn->remote_port;
#else
  /* no proxy support */
  struct ssl_primary_config * const ssl_config = &conn->ssl_config;
  const char * const name = conn->host.name;
  int port = conn->remote_port;
#endif
  (void)sockindex;
  *ssl_sessionid = NULL;

#ifdef CURL_DISABLE_PROXY
  if(isProxy)
    return TRUE;
#endif

  DEBUGASSERT(SSL_SET_OPTION(primary.sessionid));

  if(!SSL_SET_OPTION(primary.sessionid) || !data->state.session)
    /* session ID re-use is disabled or the session cache has not been
       setup */
    return TRUE;

  /* Lock if shared */
  if(SSLSESSION_SHARED(data))
    general_age = &data->share->sessionage;
  else
    general_age = &data->state.sessionage;

  for(i = 0; i < data->set.general_ssl.max_ssl_sessions; i++) {
    check = &data->state.session[i];
    if(!check->sessionid)
      /* not session ID means blank entry */
      continue;
    if(strcasecompare(name, check->name) &&
       ((!conn->bits.conn_to_host && !check->conn_to_host) ||
        (conn->bits.conn_to_host && check->conn_to_host &&
         strcasecompare(conn->conn_to_host.name, check->conn_to_host))) &&
       ((!conn->bits.conn_to_port && check->conn_to_port == -1) ||
        (conn->bits.conn_to_port && check->conn_to_port != -1 &&
         conn->conn_to_port == check->conn_to_port)) &&
       (port == check->remote_port) &&
       strcasecompare(conn->handler->scheme, check->scheme) &&
       Curl_ssl_config_matches(ssl_config, &check->ssl_config)) {
      /* yes, we have a session ID! */
      (*general_age)++;          /* increase general age */
      check->age = *general_age; /* set this as used in this age */
      *ssl_sessionid = check->sessionid;
      if(idsize)
        *idsize = check->idsize;
      no_match = FALSE;
      break;
    }
  }

  DEBUGF(infof(data, "%s Session ID in cache for %s %s://%s:%d",
               no_match? "Didn't find": "Found",
               isProxy ? "proxy" : "host",
               conn->handler->scheme, name, port));
  return no_match;
}